

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_res.h
# Opt level: O0

void __thiscall
hiberlite::shared_cnt_obj_pair<hiberlite::autoclosed_con>::~shared_cnt_obj_pair
          (shared_cnt_obj_pair<hiberlite::autoclosed_con> *this)

{
  autoclosed_con *this_00;
  logic_error *this_01;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *this_local;
  
  this->_vptr_shared_cnt_obj_pair = (_func_int **)&PTR__shared_cnt_obj_pair_001d7a50;
  if (this->refCount != 0) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"resource is busy");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_00 = this->res;
  if (this_00 != (autoclosed_con *)0x0) {
    autoclosed_con::~autoclosed_con(this_00);
    operator_delete(this_00);
  }
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

inline virtual ~shared_cnt_obj_pair(){
		if(refCount)
			throw std::logic_error("resource is busy");
		delete res;
	}